

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> __thiscall
slang::driver::Driver::createCompilation(Driver *this)

{
  __shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Compilation *this_00;
  Driver *in_RSI;
  __shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2> local_60;
  sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
  local_50;
  
  createOptionBag((Bag *)&local_50,in_RSI);
  std::make_unique<slang::ast::Compilation,slang::Bag>((Bag *)this);
  ska::detailv3::
  sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
  ::~sherwood_v3_table(&local_50);
  p_Var1 = &((in_RSI->syntaxTrees).
             super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((in_RSI->syntaxTrees).
                  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    this_00 = (Compilation *)
              (this->cmdLine).positional.
              super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,p_Var2);
    ast::Compilation::addSyntaxTree(this_00,(shared_ptr<slang::syntax::SyntaxTree> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  }
  return (__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
          )(__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Compilation> Driver::createCompilation() const {
    auto compilation = std::make_unique<Compilation>(createOptionBag());
    for (auto& tree : syntaxTrees)
        compilation->addSyntaxTree(tree);

    return compilation;
}